

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  element_type *this;
  ContextType *pCVar3;
  element_type *err_00;
  ContextType *ctx;
  undefined1 local_30 [8];
  shared_ptr<fake::ErrLERandNum1> rerr;
  Error err;
  int i;
  
  for (err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _0_4_ = -1;
      (int)err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi < 5;
      err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = (int)err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Handling ");
    poVar2 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)poVar2,
                        (int)err.
                             super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
    std::operator<<(poVar2,":\n");
    fake::MyFakeAPI::Call
              ((MyFakeAPI *)
               &rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(int)err.super___shared_ptr<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
    bVar1 = std::operator!=((shared_ptr<gerr::details::IError> *)
                            &rerr.
                             super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount,(nullptr_t)0x0);
    if (bVar1) {
      gerr::As<fake::ErrLERandNum1,gerr::details::IError,void>
                ((gerr *)local_30,
                 (shared_ptr<gerr::details::IError> *)
                 &rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar1 = std::operator!=((shared_ptr<fake::ErrLERandNum1> *)local_30,(nullptr_t)0x0);
      if (bVar1) {
        this = std::
               __shared_ptr_access<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
        pCVar3 = fake::ErrLERandNum1::Context(this);
        poVar2 = std::operator<<((ostream *)&std::cout,"ErrLERandNum, rand val1:");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pCVar3->randNum1);
        poVar2 = std::operator<<(poVar2,";");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pCVar3->randNum2);
        std::operator<<(poVar2,"\n");
      }
      else {
        bVar1 = gerr::Is<fake::ErrArgumentZero,gerr::details::IError,void>
                          ((shared_ptr<gerr::details::IError> *)
                           &rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
        if (bVar1) {
          std::operator<<((ostream *)&std::cout,"I don\'t care arg zero error\n");
        }
        else {
          bVar1 = gerr::IsCode<gerr::details::IError,void>
                            (0x7b,(shared_ptr<gerr::details::IError> *)
                                  &rerr.
                                   super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_refcount);
          if (bVar1) {
            std::operator<<((ostream *)&std::cout,"I don\'t care a dummy error");
          }
          else {
            err_00 = std::
                     __shared_ptr_access<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<gerr::details::IError,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&rerr.
                                     super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount);
            poVar2 = gerr::details::operator<<((ostream *)&std::cerr,err_00);
            std::operator<<(poVar2,"\n");
          }
        }
      }
      std::shared_ptr<fake::ErrLERandNum1>::~shared_ptr((shared_ptr<fake::ErrLERandNum1> *)local_30)
      ;
    }
    else {
      std::operator<<((ostream *)&std::cout,"Nothing happened\n");
    }
    std::shared_ptr<gerr::details::IError>::~shared_ptr
              ((shared_ptr<gerr::details::IError> *)
               &rerr.super___shared_ptr<fake::ErrLERandNum1,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
  }
  return 0;
}

Assistant:

int main() {
  for (int i = -1; i < 5; i++) {
    std::cout << "Handling " << i << ":\n";
    auto const err = fake::MyFakeAPI::Call(i);
    if (err != nullptr) {
      auto const rerr = gerr::As<fake::ErrLERandNum1>(err);
      if (rerr != nullptr) {
        // 将通用错误转换为特定错误
        auto const &ctx = rerr->Context();
        std::cout << "ErrLERandNum, rand val1:" << ctx.randNum1 << ";"
                  << ctx.randNum2 << "\n";
      } else if (gerr::Is<fake::ErrArgumentZero>(err)) {
        // 检查一个错误是否是特定的错误，by type
        std::cout << "I don't care arg zero error\n";
      } else if (gerr::IsCode(123, err)) {
        // 检查一个错误是否是特定的错误，by error code
        std::cout << "I don't care a dummy error";
      } else {
        // 简单格式化错误链条并打印错误
        std::cerr << *err << "\n";
      }
    } else {
      std::cout << "Nothing happened\n";
    }
  }
  return 0;
}